

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

float stbir__filter_cubic(float x,float s,void *user_data)

{
  float fVar1;
  float fVar2;
  
  fVar2 = -x;
  if (-x <= x) {
    fVar2 = x;
  }
  if (fVar2 < 1.0) {
    return ((fVar2 * 3.0 + -6.0) * fVar2 * fVar2 + 4.0) / 6.0;
  }
  fVar1 = 0.0;
  if (fVar2 < 2.0) {
    fVar1 = (((6.0 - fVar2) * fVar2 + -12.0) * fVar2 + 8.0) / 6.0;
  }
  return fVar1;
}

Assistant:

static float stbir__filter_cubic(float x, float s, void * user_data)
{
  STBIR__UNUSED(s);
  STBIR__UNUSED(user_data);

  if ( x < 0.0f ) x = -x;

  if (x < 1.0f)
    return (4.0f + x*x*(3.0f*x - 6.0f))/6.0f;
  else if (x < 2.0f)
    return (8.0f + x*(-12.0f + x*(6.0f - x)))/6.0f;

  return (0.0f);
}